

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O3

void Ssw_ManLabelPiNodes(Ssw_Man_t *p)

{
  undefined1 *puVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Aig_Man_t *pAVar6;
  
  puVar1 = &p->pFrames->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x10;
  puVar1 = &p->pFrames->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  iVar4 = p->nFrames;
  if (0 < iVar4) {
    pAVar6 = p->pAig;
    iVar3 = 0;
    do {
      if (0 < pAVar6->nTruePis) {
        lVar5 = 0;
        do {
          if (pAVar6->vCis->nSize <= lVar5) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar2 = *(ulong *)&p->pNodeToFrames
                             [*(int *)((long)pAVar6->vCis->pArray[lVar5] + 0x24) * p->nFrames +
                              iVar3]->field_0x18;
          if (((uint)uVar2 & 7) != 2) {
            __assert_fail("Aig_ObjIsCi(pObjFrames)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                          ,0x39,"void Ssw_ManLabelPiNodes(Ssw_Man_t *)");
          }
          if ((uVar2 & 0x20) != 0) {
            __assert_fail("pObjFrames->fMarkB == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                          ,0x3a,"void Ssw_ManLabelPiNodes(Ssw_Man_t *)");
          }
          *(ulong *)&p->pNodeToFrames
                     [*(int *)((long)pAVar6->vCis->pArray[lVar5] + 0x24) * p->nFrames + iVar3]->
                     field_0x18 = uVar2 | 0x30;
          lVar5 = lVar5 + 1;
          pAVar6 = p->pAig;
        } while (lVar5 < pAVar6->nTruePis);
        iVar4 = p->nFrames;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < iVar4);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Label PIs nodes of the frames corresponding to PIs of AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManLabelPiNodes( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFrames;
    int f, i;
    Aig_ManConst1( p->pFrames )->fMarkA = 1;
    Aig_ManConst1( p->pFrames )->fMarkB = 1;
    for ( f = 0; f < p->nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFrames = Ssw_ObjFrame( p, pObj, f );
            assert( Aig_ObjIsCi(pObjFrames) );
            assert( pObjFrames->fMarkB == 0 );
            pObjFrames->fMarkA = 1;
            pObjFrames->fMarkB = 1;
        }
    }
}